

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Seanet.h
# Opt level: O1

int HeadDataReplySeanet(SEANET *pSeanet,uchar *scanline,double *pAngle)

{
  byte bVar1;
  int iVar2;
  HDCTRL HVar3;
  long lVar4;
  uchar databuf [2048];
  int local_82c;
  uchar local_828 [16];
  byte local_818;
  ushort local_816;
  ushort local_814;
  byte local_80e;
  ushort local_80d;
  byte local_80b;
  byte local_80a;
  ushort local_807;
  ushort local_805;
  ushort local_803;
  byte local_801;
  ushort local_800;
  ushort local_7fe;
  byte local_7fc [2012];
  
  memset(local_828,0,0x800);
  local_82c = 0;
  iVar2 = GetMsgSeanet(pSeanet,2,local_828,0x800,&local_82c);
  if (iVar2 == 0) {
    pSeanet->HeadStatus = (uint)local_818;
    HVar3.u._2_2_ = 0;
    HVar3.u._0_2_ = local_816;
    pSeanet->HeadHdCtrl = HVar3;
    pSeanet->HeadRangescale = (uint)local_814;
    pSeanet->HeadIGain = (uint)local_80e;
    pSeanet->HeadSlope = (uint)local_80d;
    pSeanet->HeadADSpan = (uint)local_80b;
    pSeanet->HeadADLow = (uint)local_80a;
    pSeanet->HeadADInterval = (uint)local_807;
    pSeanet->HeadLeftLim = (uint)local_805;
    pSeanet->HeadRightLim = (uint)local_803;
    pSeanet->HeadSteps = (uint)local_801;
    *pAngle = (double)(int)((uint)local_800 + ((local_800 + 0xc80) / 0x1900) * -0x1900 + 0xc80) *
              0.05625;
    pSeanet->Dbytes = (uint)local_7fe;
    if (local_7fe + 0x2d == local_82c) {
      if (pSeanet->adc8on == 0) {
        iVar2 = pSeanet->Dbytes;
        if (0 < iVar2) {
          lVar4 = 0;
          do {
            bVar1 = local_7fc[lVar4];
            scanline[lVar4 * 2] = bVar1 & 0xf0;
            scanline[lVar4 * 2 + 1] = bVar1 << 4;
            lVar4 = lVar4 + 1;
            iVar2 = pSeanet->Dbytes;
          } while (lVar4 < iVar2);
        }
        pSeanet->HeadNBins = iVar2 * 2;
      }
      else {
        memcpy(scanline,local_7fc,(ulong)local_7fe);
        pSeanet->HeadNBins = pSeanet->Dbytes;
      }
      return 0;
    }
  }
  puts("A Seanet is not responding correctly. ");
  return 1;
}

Assistant:

inline int HeadDataReplySeanet(SEANET* pSeanet, unsigned char* scanline, double* pAngle)
{
	unsigned char databuf[MAX_NB_BYTES_SEANET];
	int nbdatabytes = 0;
	uShort_SEANET word;
	int j = 0;

	// Wait for a mtHeadData message.
	memset(databuf, 0, sizeof(databuf));
	nbdatabytes = 0;
	//if (GetLatestMsgSeanet(pSeanet, mtHeadData, databuf, sizeof(databuf), &nbdatabytes)
	//	!= EXIT_SUCCESS)
	if (GetMsgSeanet(pSeanet, mtHeadData, databuf, sizeof(databuf), &nbdatabytes)
		!= EXIT_SUCCESS)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// Analyze data.

	//memset(pSeanetData, 0, sizeof(SEANETDATA));

	// Head Status.
	pSeanet->HeadStatus = (unsigned char)databuf[16];

	// HdCtrl.
	word.c[0] = (unsigned char)databuf[18]; // LSB.
	word.c[1] = (unsigned char)databuf[19]; // MSB.
	pSeanet->HeadHdCtrl.i = word.v;

	// Rangescale. Normally, we should check the unit but it should have been requested in m...
	word.c[0] = (unsigned char)databuf[20]; // LSB.
	word.c[1] = (unsigned char)databuf[21]; // MSB.
	pSeanet->HeadRangescale = word.v;

	// Gain.
	pSeanet->HeadIGain = (unsigned char)databuf[26];

	// Slope.
	word.c[0] = (unsigned char)databuf[27]; // LSB.
	word.c[1] = (unsigned char)databuf[28]; // MSB.
	pSeanet->HeadSlope = word.v;

	// ADSpan.
	pSeanet->HeadADSpan = (unsigned char)databuf[29];

	// ADLow.
	pSeanet->HeadADLow = (unsigned char)databuf[30];

	// ADInterval.
	word.c[0] = (unsigned char)databuf[33]; // LSB.
	word.c[1] = (unsigned char)databuf[34]; // MSB.
	pSeanet->HeadADInterval = word.v;

	// LeftLim.
	word.c[0] = (unsigned char)databuf[35]; // LSB.
	word.c[1] = (unsigned char)databuf[36]; // MSB.
	pSeanet->HeadLeftLim = word.v;

	// RightLim.
	word.c[0] = (unsigned char)databuf[37]; // LSB.
	word.c[1] = (unsigned char)databuf[38]; // MSB.
	pSeanet->HeadRightLim = word.v;

	// Steps.
	pSeanet->HeadSteps = (unsigned char)databuf[39];

	// Transducer Bearing. 
	// This is the position of the transducer for the current scanline (0..6399 in 1/16 Gradian units).

	// Ahead corresponds to 3200?

	word.c[0] = (unsigned char)databuf[40]; // LSB.
	word.c[1] = (unsigned char)databuf[41]; // MSB.
	*pAngle = ((word.v-3200+6400)%6400)*0.05625; // Angle of the transducer in degrees (0.05625 = (1/16)*(9/10)).

	// Dbytes.
	word.c[0] = (unsigned char)databuf[42]; // LSB.
	word.c[1] = (unsigned char)databuf[43]; // MSB.
	pSeanet->Dbytes = word.v; // Dbytes defines the number of Range Bins that the sonar will generate for the Head Data reply message.

	// There are 44 bytes of Message Header and Device Parameter Block.

	if (44+pSeanet->Dbytes+1 != nbdatabytes)
	{ 
		printf("A Seanet is not responding correctly. \n");
		return EXIT_FAILURE;	
	}

	// We should take into account ADLow and ADSpan here?

	// Retrieve the scanline data from the data received.
	if (!pSeanet->adc8on)	
	{ 
		// If adc8on = 0, the scanlines data received are in 4 bit (1/2 byte).
		// The amplitude values are between 0 and 15 so we multiply by 16
		// to get values between 0 and 255.
		for (j = 0; j < pSeanet->Dbytes; j++)
		{
			scanline[2*j+0] = (unsigned char)((databuf[j+44]>>4)*16);
			scanline[2*j+1] = (unsigned char)(((databuf[j+44]<<4)>>4)*16);
		}
		pSeanet->HeadNBins = 2*pSeanet->Dbytes;
	}
	else	
	{
		// If adc8on = 1, the scanlines data received are in 8 bit (1 byte).
		// The amplitude values are between 0 and 255.
		memcpy(scanline, databuf+44, pSeanet->Dbytes); // Copy the data received without the header (which was the 44 first bytes).
		pSeanet->HeadNBins = pSeanet->Dbytes;
	}

	// Last data...?

	return EXIT_SUCCESS;
}